

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackGenerator.cxx
# Opt level: O0

string * __thiscall
cmCPackGenerator::GetComponentPackageFileName
          (string *__return_storage_ptr__,cmCPackGenerator *this,string *initialPackageFileName,
          string *groupOrComponentName,bool isGroupName)

{
  bool bVar1;
  string *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  cmValue local_190;
  cmValue dispName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  undefined1 local_148 [8];
  string dispVar;
  cmValue local_108;
  cmValue groupDispName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined1 local_c0 [8];
  string groupDispVar;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  undefined1 local_70 [8];
  string dispNameVar;
  string suffix;
  bool isGroupName_local;
  string *groupOrComponentName_local;
  string *initialPackageFileName_local;
  cmCPackGenerator *this_local;
  
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dispNameVar.field_2 + 8),"-",groupOrComponentName);
  std::operator+(&local_90,"CPACK_",&this->Name);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_70,
                 &local_90,"_USE_DISPLAY_NAME_IN_FILENAME");
  std::__cxx11::string::~string((string *)&local_90);
  bVar1 = IsOn(this,(string *)local_70);
  if (bVar1) {
    if (isGroupName) {
      cmsys::SystemTools::UpperCase((string *)&groupDispName,groupOrComponentName);
      std::operator+(&local_e0,"CPACK_COMPONENT_GROUP_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &groupDispName);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_c0,
                     &local_e0,"_DISPLAY_NAME");
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&groupDispName);
      local_108 = GetOption(this,(string *)local_c0);
      bVar1 = cmValue::operator_cast_to_bool(&local_108);
      if (bVar1) {
        psVar2 = cmValue::operator*[abi_cxx11_(&local_108);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&dispVar.field_2 + 8),"-",psVar2);
        std::__cxx11::string::operator=
                  ((string *)(dispNameVar.field_2._M_local_buf + 8),
                   (string *)(dispVar.field_2._M_local_buf + 8));
        std::__cxx11::string::~string((string *)(dispVar.field_2._M_local_buf + 8));
      }
      std::__cxx11::string::~string((string *)local_c0);
    }
    else {
      cmsys::SystemTools::UpperCase((string *)&dispName,groupOrComponentName);
      std::operator+(&local_168,"CPACK_COMPONENT_",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dispName)
      ;
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_148,
                     &local_168,"_DISPLAY_NAME");
      std::__cxx11::string::~string((string *)&local_168);
      std::__cxx11::string::~string((string *)&dispName);
      local_190 = GetOption(this,(string *)local_148);
      bVar1 = cmValue::operator_cast_to_bool(&local_190);
      if (bVar1) {
        psVar2 = cmValue::operator*[abi_cxx11_(&local_190);
        std::operator+(&local_1b0,"-",psVar2);
        std::__cxx11::string::operator=
                  ((string *)(dispNameVar.field_2._M_local_buf + 8),(string *)&local_1b0);
        std::__cxx11::string::~string((string *)&local_1b0);
      }
      std::__cxx11::string::~string((string *)local_148);
    }
  }
  std::operator+(__return_storage_ptr__,initialPackageFileName,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&dispNameVar.field_2 + 8));
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::~string((string *)(dispNameVar.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string cmCPackGenerator::GetComponentPackageFileName(
  const std::string& initialPackageFileName,
  const std::string& groupOrComponentName, bool isGroupName)
{

  /*
   * the default behavior is to use the
   * component [group] name as a suffix
   */
  std::string suffix = "-" + groupOrComponentName;
  /* check if we should use DISPLAY name */
  std::string dispNameVar =
    "CPACK_" + this->Name + "_USE_DISPLAY_NAME_IN_FILENAME";
  if (this->IsOn(dispNameVar)) {
    /* the component Group case */
    if (isGroupName) {
      std::string groupDispVar = "CPACK_COMPONENT_GROUP_" +
        cmSystemTools::UpperCase(groupOrComponentName) + "_DISPLAY_NAME";
      cmValue groupDispName = this->GetOption(groupDispVar);
      if (groupDispName) {
        suffix = "-" + *groupDispName;
      }
    }
    /* the [single] component case */
    else {
      std::string dispVar = "CPACK_COMPONENT_" +
        cmSystemTools::UpperCase(groupOrComponentName) + "_DISPLAY_NAME";
      cmValue dispName = this->GetOption(dispVar);
      if (dispName) {
        suffix = "-" + *dispName;
      }
    }
  }
  return initialPackageFileName + suffix;
}